

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O2

void regprint(regex_t *r,FILE *d)

{
  re_guts *prVar1;
  cat_t *pcVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  ulong uVar6;
  int iVar7;
  int ch;
  char *pcVar8;
  long lVar9;
  uint *puVar10;
  long *plVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  int local_43c;
  int nincat [256];
  
  prVar1 = r->re_g;
  fprintf((FILE *)d,"%ld states, %d categories",prVar1->nstates,(ulong)(uint)prVar1->ncategories);
  fprintf((FILE *)d,", first %ld last %ld",prVar1->firststate,prVar1->laststate);
  uVar3 = prVar1->iflags;
  if ((uVar3 & 1) != 0) {
    fwrite(", USEBOL",8,1,(FILE *)d);
    uVar3 = prVar1->iflags;
  }
  if ((uVar3 & 2) != 0) {
    fwrite(", USEEOL",8,1,(FILE *)d);
    uVar3 = prVar1->iflags;
  }
  if ((uVar3 & 4) != 0) {
    fwrite(", BAD",5,1,(FILE *)d);
  }
  if (prVar1->nsub != 0) {
    fprintf((FILE *)d,", nsub=%ld");
  }
  if (prVar1->must != (char *)0x0) {
    fprintf((FILE *)d,", must(%ld) `%*s\'",(long)prVar1->mlen);
  }
  if (prVar1->backrefs != 0) {
    fwrite(", backrefs",10,1,(FILE *)d);
  }
  if (0 < prVar1->nplus) {
    fprintf((FILE *)d,", nplus %ld");
  }
  fputc(10,(FILE *)d);
  puVar10 = (uint *)prVar1->strip;
  if ((*puVar10 & 0x7c000000) != 0x4000000) {
    fwrite("missing initial OEND!\n",0x16,1,(FILE *)d);
    puVar10 = (uint *)prVar1->strip;
  }
  uVar13 = 2;
  uVar12 = 1;
  local_43c = 0;
LAB_00109c98:
  bVar14 = true;
LAB_00109c9e:
  puVar10 = puVar10 + 2;
  if (bVar14) {
    uVar3 = (uint)*(undefined8 *)puVar10;
    switch((ulong)(uVar3 & 0x7c000000) - 0x4000000 >> 0x1a) {
    case 0:
      goto switchD_00109cd6_caseD_0;
    case 1:
      goto switchD_00109cd6_caseD_1;
    case 2:
      iVar7 = 0x5e;
      goto LAB_0010a04a;
    case 3:
      iVar7 = 0x24;
      goto LAB_0010a04a;
    case 4:
      iVar7 = 0x2e;
      goto LAB_0010a04a;
    case 5:
      fprintf((FILE *)d,"[(%ld)",(ulong)(uVar3 & 0x3ffffff));
      plVar11 = (long *)((long)&prVar1->sets->ptr + (ulong)((uVar3 & 0x3ffffff) << 5));
      uVar3 = 0xffffffff;
      for (uVar4 = 0; (int)uVar4 <= prVar1->csetsize; uVar4 = uVar4 + 1) {
        if (((int)uVar4 < prVar1->csetsize) &&
           ((*(byte *)(plVar11 + 1) & *(byte *)(*plVar11 + (ulong)(uVar4 & 0xff))) != 0)) {
          if ((int)uVar3 < 0) {
            regchar(uVar4);
            fputs(regchar::buf,(FILE *)d);
            uVar3 = uVar4;
          }
        }
        else if (-1 < (int)uVar3) {
          bVar14 = uVar4 - 1 != uVar3;
          uVar3 = 0xffffffff;
          if (bVar14) {
            regchar(uVar4 - 1);
            fprintf((FILE *)d,"-%s",regchar::buf);
            uVar3 = 0xffffffff;
          }
        }
      }
      iVar7 = 0x5d;
LAB_0010a04a:
      fputc(iVar7,(FILE *)d);
      goto LAB_0010a052;
    case 6:
      uVar6 = (ulong)(uVar3 & 0x3ffffff);
      pcVar8 = "(\\<%ld>";
      break;
    case 7:
      uVar6 = (ulong)(uVar3 & 0x3ffffff);
      pcVar8 = "<%ld>\\)";
      break;
    case 8:
      uVar6 = (ulong)(uVar3 & 0x3ffffff);
      fwrite("(+",2,1,(FILE *)d);
      if ((puVar10[uVar6 * 2] & 0x7c000000) != 0x28000000) goto LAB_00109f53;
      goto LAB_0010a052;
    case 9:
      if ((*(uint *)((long)puVar10 - (ulong)((uVar3 & 0x3ffffff) * 8)) & 0x7c000000) != 0x24000000)
      {
        fprintf((FILE *)d,"<%ld>",(ulong)(uVar3 & 0x3ffffff));
      }
      pcVar8 = "+)";
      goto LAB_00109ff7;
    case 10:
      uVar6 = (ulong)(uVar3 & 0x3ffffff);
      fwrite("(?",2,1,(FILE *)d);
      if ((puVar10[uVar6 * 2] & 0x7c000000) != 0x30000000) goto LAB_00109f53;
      goto LAB_0010a052;
    case 0xb:
      if ((*(uint *)((long)puVar10 - (ulong)((uVar3 & 0x3ffffff) * 8)) & 0x7c000000) != 0x2c000000)
      {
        fprintf((FILE *)d,"<%ld>",(ulong)(uVar3 & 0x3ffffff));
      }
      pcVar8 = "?)";
      goto LAB_00109ff7;
    case 0xc:
      uVar6 = (ulong)(uVar3 & 0x3ffffff);
      pcVar8 = "((<%ld>";
      break;
    case 0xd:
      uVar6 = (ulong)(uVar3 & 0x3ffffff);
      pcVar8 = "<%ld>))";
      break;
    case 0xe:
      uVar6 = (ulong)(uVar3 & 0x3ffffff);
      fputc(0x3c,(FILE *)d);
      if ((puVar10[uVar6 * 2] & 0x7c000000) != 0x44000000) goto LAB_00109f53;
      goto LAB_0010a052;
    case 0xf:
      uVar4 = (uint)*(undefined8 *)((long)puVar10 - (ulong)((uVar3 & 0x3ffffff) * 8)) & 0x7c000000;
      if ((uVar4 != 0x3c000000) && (uVar4 != 0x40000000)) {
        fprintf((FILE *)d,"<%ld>",(ulong)(uVar3 & 0x3ffffff));
      }
      iVar7 = 0x7c;
      goto LAB_0010a04a;
    case 0x10:
      uVar6 = (ulong)(uVar3 & 0x3ffffff);
      fputc(0x7c,(FILE *)d);
      uVar3 = (uint)*(undefined8 *)(puVar10 + uVar6 * 2) & 0x7c000000;
      if ((uVar3 == 0x44000000) || (uVar3 == 0x48000000)) goto LAB_0010a052;
LAB_00109f53:
      pcVar8 = "<%ld>";
      break;
    case 0x11:
      if ((*(uint *)((long)puVar10 - (ulong)((uVar3 & 0x3ffffff) * 8)) & 0x7c000000) != 0x40000000)
      {
        fprintf((FILE *)d,"<%ld>",(ulong)(uVar3 & 0x3ffffff));
      }
      iVar7 = 0x3e;
      goto LAB_0010a04a;
    case 0x12:
      pcVar8 = "\\{";
      goto LAB_00109ff7;
    case 0x13:
      pcVar8 = "\\}";
LAB_00109ff7:
      fwrite(pcVar8,2,1,(FILE *)d);
      goto LAB_0010a052;
    default:
      fprintf((FILE *)d,"!%ld(%ld)!",(ulong)(uVar3 & 0x7c000000),(ulong)(uVar3 & 0x3ffffff));
      goto LAB_0010a052;
    }
    fprintf((FILE *)d,pcVar8,uVar6);
    goto LAB_0010a052;
  }
  uVar6 = 0;
  uVar13 = (ulong)(uint)prVar1->ncategories;
  if (prVar1->ncategories < 1) {
    uVar13 = uVar6;
  }
  for (; uVar6 != uVar13; uVar6 = uVar6 + 1) {
    nincat[uVar6] = 0;
    pcVar2 = prVar1->categories;
    iVar7 = 0;
    for (lVar9 = -0x80; lVar9 != 0x80; lVar9 = lVar9 + 1) {
      if (uVar6 == pcVar2[lVar9]) {
        iVar7 = iVar7 + 1;
        nincat[uVar6] = iVar7;
      }
    }
  }
  fprintf((FILE *)d,"cc0#%d",(ulong)(uint)nincat[0]);
  do {
    if ((long)prVar1->ncategories <= (long)uVar12) {
      fputc(10,(FILE *)d);
      uVar13 = 1;
      while( true ) {
        if ((long)prVar1->ncategories <= (long)uVar13) {
          return;
        }
        if (nincat[uVar13] != 1) break;
LAB_0010a260:
        uVar13 = uVar13 + 1;
      }
      fprintf((FILE *)d,"cc%d\t",uVar13 & 0xffffffff);
      uVar12 = 0xffffffffffffff80;
      uVar6 = 0xffffffff;
      do {
        iVar7 = (int)uVar6;
        if (uVar12 == 0x80) {
LAB_0010a227:
          if (-1 < iVar7) {
            ch = (int)uVar12 + -1;
            uVar6 = 0xffffffff;
            if (ch != iVar7) {
              regchar(ch);
              fprintf((FILE *)d,"-%s",regchar::buf);
              uVar6 = 0xffffffff;
            }
          }
        }
        else {
          if (uVar12 == 0x81) {
            fputc(10,(FILE *)d);
            goto LAB_0010a260;
          }
          if (uVar13 != prVar1->categories[uVar12]) goto LAB_0010a227;
          if (iVar7 < 0) {
            regchar((int)uVar12);
            fputs(regchar::buf,(FILE *)d);
            uVar6 = uVar12 & 0xffffffff;
          }
        }
        uVar12 = uVar12 + 1;
      } while( true );
    }
    if (nincat[uVar12] == 1) {
      for (lVar9 = -0x80; lVar9 != 0x80; lVar9 = lVar9 + 1) {
        if (uVar12 == prVar1->categories[lVar9]) goto LAB_0010a179;
      }
      lVar9 = 0x80;
LAB_0010a179:
      regchar((int)lVar9);
      fprintf((FILE *)d,", %d=%s",uVar12 & 0xffffffff,regchar::buf);
    }
    uVar12 = uVar12 + 1;
  } while( true );
switchD_00109cd6_caseD_1:
  uVar3 = (uint)(char)*(undefined8 *)puVar10;
  pvVar5 = memchr("\\|()^$.[+*?{}!<> ",uVar3,0x12);
  if (pvVar5 == (void *)0x0) {
    regchar(uVar3);
    fputs(regchar::buf,(FILE *)d);
  }
  else {
    fprintf((FILE *)d,"\\%c",(ulong)uVar3);
  }
LAB_0010a052:
  if (uVar13 % 5 == 0) {
    if (0x28 < local_43c) {
      fwrite("\n\t",2,1,(FILE *)d);
      local_43c = 0;
      goto LAB_0010a07a;
    }
    fputc(0x20,(FILE *)d);
  }
  local_43c = local_43c + 1;
LAB_0010a07a:
  uVar13 = uVar13 + 1;
  goto LAB_00109c98;
switchD_00109cd6_caseD_0:
  fputc(10,(FILE *)d);
  bVar14 = false;
  goto LAB_00109c9e;
}

Assistant:

void
regprint(r, d)
regex_t *r;
FILE *d;
{
	struct re_guts *g = r->re_g;
	int i;
	int c;
	int last;
	int nincat[NC];

	fprintf(d, "%ld states, %d categories", (long)g->nstates,
							g->ncategories);
	fprintf(d, ", first %ld last %ld", (long)g->firststate,
						(long)g->laststate);
	if (g->iflags&USEBOL)
		fprintf(d, ", USEBOL");
	if (g->iflags&USEEOL)
		fprintf(d, ", USEEOL");
	if (g->iflags&BAD)
		fprintf(d, ", BAD");
	if (g->nsub > 0)
		fprintf(d, ", nsub=%ld", (long)g->nsub);
	if (g->must != NULL)
		fprintf(d, ", must(%ld) `%*s'", (long)g->mlen, (int)g->mlen,
								g->must);
	if (g->backrefs)
		fprintf(d, ", backrefs");
	if (g->nplus > 0)
		fprintf(d, ", nplus %ld", (long)g->nplus);
	fprintf(d, "\n");
	s_print(g, d);
	for (i = 0; i < g->ncategories; i++) {
		nincat[i] = 0;
		for (c = CHAR_MIN; c <= CHAR_MAX; c++)
			if (g->categories[c] == i)
				nincat[i]++;
	}
	fprintf(d, "cc0#%d", nincat[0]);
	for (i = 1; i < g->ncategories; i++)
		if (nincat[i] == 1) {
			for (c = CHAR_MIN; c <= CHAR_MAX; c++)
				if (g->categories[c] == i)
					break;
			fprintf(d, ", %d=%s", i, regchar(c));
		}
	fprintf(d, "\n");
	for (i = 1; i < g->ncategories; i++)
		if (nincat[i] != 1) {
			fprintf(d, "cc%d\t", i);
			last = -1;
			for (c = CHAR_MIN; c <= CHAR_MAX+1; c++)	/* +1 does flush */
				if (c <= CHAR_MAX && g->categories[c] == i) {
					if (last < 0) {
						fprintf(d, "%s", regchar(c));
						last = c;
					}
				} else {
					if (last >= 0) {
						if (last != c-1)
							fprintf(d, "-%s",
								regchar(c-1));
						last = -1;
					}
				}
			fprintf(d, "\n");
		}
}